

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O2

void __thiscall GOESRImageHandler::handleImage(GOESRImageHandler *this,GOESRProduct *product)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  string path;
  Timer t;
  string local_4a8;
  Mat mat;
  undefined8 local_478;
  map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  idf;
  GOESRProduct local_3f8;
  FilenameBuilder fb;
  
  Timer::Timer(&t);
  if (*(long *)&(this->config_).field_0x158 == 0) {
    GOESRProduct::getImage((GOESRProduct *)&image,(Handler *)product);
    GOESRProduct::getFilenameBuilder(&fb,product,&this->config_);
    this_00 = &(this->config_).gradient;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
            ::find(&this_00->_M_t,&(product->product_).nameShort);
    p_Var1 = &(this->config_).gradient._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
      bVar2 = std::operator==(&(product->product_).nameShort,"CMIP");
      if (bVar2) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Gradient>_>_>
                ::find(&this_00->_M_t,&(product->channel_).nameShort);
      }
    }
    GOESRProduct::loadImageDataFunction(&idf,product);
    if (((_Rb_tree_header *)iVar3._M_node != p_Var1) &&
       (idf._M_t._M_impl.super__Rb_tree_header._M_node_count == 0x100)) {
      cv::Mat::Mat(&mat,0x100,1,0x10);
      for (p_Var4 = idf._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &idf._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        Gradient::interpolate
                  ((GradientPoint *)&path,(Gradient *)(iVar3._M_node + 2),
                   *(float *)&p_Var4[1].field_0x4,(this->config_).lerptype);
        *(char *)(local_478 + (ulong)(p_Var4[1]._M_color * 3)) =
             (char)(int)(path._M_string_length._4_4_ * 255.0);
        *(char *)(local_478 + (ulong)(p_Var4[1]._M_color * 3 + 1)) =
             (char)(int)((float)path._M_string_length * 255.0);
        *(char *)(local_478 + (ulong)(p_Var4[1]._M_color * 3 + 2)) =
             (char)(int)(path._M_dataplus._M_p._4_4_ * 255.0);
      }
      Image::remap((Image *)image._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>.
                            _M_t.super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                            super__Head_base<0UL,_Image_*,_false>._M_head_impl,&mat);
      cv::Mat::~Mat(&mat);
    }
    Image::getRawImage((Image *)&mat);
    std::__cxx11::string::string((string *)&local_4a8,(string *)&(this->config_).format);
    FilenameBuilder::build(&path,&fb,&(this->config_).filename,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    FileWriter::write((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(int)&path,&mat,(size_t)&t);
    if ((this->config_).json == true) {
      FileWriter::writeHeader
                ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(((product->files_).
                          super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 &path);
    }
    std::__cxx11::string::~string((string *)&path);
    cv::Mat::~Mat(&mat);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::~_Rb_tree(&idf._M_t);
    FilenameBuilder::~FilenameBuilder(&fb);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr(&image);
  }
  else {
    GOESRProduct::GOESRProduct(&local_3f8,product);
    handleImageForFalseColor(this,&local_3f8);
    GOESRProduct::~GOESRProduct(&local_3f8);
  }
  return;
}

Assistant:

void GOESRImageHandler::handleImage(GOESRProduct product) {
  Timer t;

  // If this handler is configured to produce false color images
  // we pass the image to a separate handler.
  if (config_.lut.data) {
    handleImageForFalseColor(std::move(product));
    return;
  }

  auto image = product.getImage(config_);
  auto fb = product.getFilenameBuilder(config_);

  // If there's a parametric gradient configured, use it in
  // combination with the LRIT ImageDataFunction to map
  // CMIP grey levels to temperature units (Kelvin), then map
  // those temperatures onto the RGB gradient.
  const auto& productName = product.getProduct().nameShort;
  auto grad = config_.gradient.find(productName);

  // For CMIP files we use the channel name to find the gradient.
  if (grad == std::end(config_.gradient) && productName == "CMIP") {
    grad = config_.gradient.find(product.getChannel().nameShort);
  }

  auto idf = product.loadImageDataFunction();

  // This is stored in an 256x1 RGB matrix for use in Image::remap()
  if (grad != std::end(config_.gradient) && idf.size() == 256) {
    cv::Mat gradientMap(256, 1, CV_8UC3);
    for (const auto& i : idf) {
      auto p = grad->second.interpolate(i.second, config_.lerptype);
      gradientMap.data[i.first * 3] = p.rgb[2] * 255;
      gradientMap.data[i.first * 3 + 1] = p.rgb[1] * 255;
      gradientMap.data[i.first * 3 + 2] = p.rgb[0] * 255;
    }
    image->remap(gradientMap);
  }

  auto mat = image->getRawImage();
  overlayMaps(product, mat);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, mat, &t);
  if (config_.json) {
    fileWriter_->writeHeader(product.firstFile(), path);
  }
}